

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# funzip.cpp
# Opt level: O0

void __thiscall FUnzip::smartDestDir(FUnzip *this,ZipStream *zs)

{
  bool bVar1;
  size_type sVar2;
  Entry *pEVar3;
  long lVar4;
  reference name;
  Entry *e;
  iterator __end1;
  iterator __begin1;
  ZipStream *__range1;
  undefined1 local_88 [8];
  string first;
  size_type pos;
  string n;
  ZipStream *zs_local;
  FUnzip *this_local;
  
  sVar2 = ZipStream::size(zs);
  if (sVar2 != 1) {
    path_basename((string *)((long)&n.field_2 + 8),&this->zipName);
    std::__cxx11::string::operator=
              ((string *)&this->destinationDir,(string *)(n.field_2._M_local_buf + 8));
    std::__cxx11::string::~string((string *)(n.field_2._M_local_buf + 8));
    pEVar3 = ZipStream::getEntry(zs,0);
    std::__cxx11::string::string((string *)&pos,(string *)pEVar3);
    lVar4 = std::__cxx11::string::find((char)&pos,0x2f);
    if (lVar4 == -1) {
      first.field_2._12_4_ = 1;
    }
    else {
      std::__cxx11::string::substr((ulong)local_88,(ulong)&pos);
      __end1 = ZipStream::begin(zs);
      e = (Entry *)ZipStream::end(zs);
      while (bVar1 = __gnu_cxx::operator!=
                               (&__end1,(__normal_iterator<ZipStream::Entry_*,_std::vector<ZipStream::Entry,_std::allocator<ZipStream::Entry>_>_>
                                         *)&e), bVar1) {
        name = __gnu_cxx::
               __normal_iterator<ZipStream::Entry_*,_std::vector<ZipStream::Entry,_std::allocator<ZipStream::Entry>_>_>
               ::operator*(&__end1);
        bVar1 = startsWith(&name->name,(string *)local_88);
        if (!bVar1) {
          first.field_2._12_4_ = 1;
          goto LAB_00151777;
        }
        __gnu_cxx::
        __normal_iterator<ZipStream::Entry_*,_std::vector<ZipStream::Entry,_std::allocator<ZipStream::Entry>_>_>
        ::operator++(&__end1);
      }
      std::__cxx11::string::operator=((string *)&this->destinationDir,"");
      first.field_2._12_4_ = 0;
LAB_00151777:
      std::__cxx11::string::~string((string *)local_88);
    }
    std::__cxx11::string::~string((string *)&pos);
  }
  return;
}

Assistant:

void FUnzip::smartDestDir(ZipStream& zs)
{
    if (zs.size() == 1)
        return;

    destinationDir = path_basename(zipName);

    auto n = zs.getEntry(0).name;

    auto pos = n.find('/');
    if (pos == std::string::npos)
        return;
    std::string first = n.substr(0, pos);

    for (const auto& e : zs) {
        if (!startsWith(e.name, first))
            return;
    }
    destinationDir = "";
}